

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

void Lf_ObjMergeOrder(Lf_Man_t *p,int iObj)

{
  long lVar1;
  float fVar2;
  byte bVar3;
  uint nCutNum;
  int iVar4;
  Jf_Par_t *pJVar5;
  int *piVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Lf_Cut_t *pLVar9;
  Lf_Cut_t *pCut;
  uint *puVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint fCompl0;
  int iVar17;
  int iVar18;
  uint nCuts;
  int iVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  Gia_Obj_t *pObj;
  Lf_Bst_t *pLVar23;
  long lVar24;
  ulong uVar25;
  Lf_Bst_t *pLVar26;
  Gia_Obj_t *pGVar27;
  ulong uVar28;
  word wVar29;
  word *pwVar30;
  long lVar31;
  word wVar32;
  ulong uVar33;
  Lf_Cut_t *pLVar34;
  uint fCompl1;
  int iVar35;
  uint uVar36;
  ulong uVar37;
  int iVar38;
  Lf_Cut_t *pLVar39;
  Lf_Cut_t *pLVar40;
  long lVar41;
  undefined4 *puVar42;
  Gia_Man_t *p_00;
  Lf_Cut_t *pLVar43;
  uint nLutSize;
  bool bVar44;
  float FlowRefs;
  int local_1828;
  int local_180c;
  Lf_Cut_t *pCutSet1;
  Lf_Cut_t *pCutSet0;
  Lf_Cut_t *local_1750;
  word *local_1748;
  Lf_Cut_t *pCutSet2;
  Lf_Cut_t *pCutsR [32];
  word uTruth [128];
  word local_1238 [128];
  word uTruth0 [128];
  word CutSet [32] [10];
  
  pLVar34 = (Lf_Cut_t *)CutSet;
  local_1828 = 0;
  memset(pLVar34,0,0xa00);
  pObj = Gia_ManObj(p->pGia,iObj);
  pLVar23 = Lf_ObjReadBest(p,iObj);
  iVar14 = Vec_IntEntry(&p->vOffsets,iObj);
  FlowRefs = Vec_FltEntry(&p->vFlowRefs,iVar14);
  local_180c = Vec_IntEntry(&p->vRequired,iObj);
  pJVar5 = p->pPars;
  nCutNum = pJVar5->nCutNum;
  uVar28 = (long)pJVar5->nLutSize / 2 & 0xffffffff;
  if (pJVar5->fCutGroup == 0) {
    uVar28 = (ulong)(uint)pJVar5->nLutSize;
  }
  lVar24 = (long)p->nCutWords;
  uVar25 = *(ulong *)pObj;
  iVar14 = Lf_ManPrepareSet(p,iObj - ((uint)uVar25 & 0x1fffffff),0,&pCutSet0);
  iVar15 = Lf_ManPrepareSet(p,iObj - (*(uint *)&pObj->field_0x4 & 0x1fffffff),1,&pCutSet1);
  piVar6 = p->pGia->pSibls;
  if (piVar6 != (int *)0x0) {
    local_1828 = piVar6[iObj];
  }
  iVar16 = Gia_ObjIsBuf(pObj);
  if (iVar16 != 0) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                  ,0x4b5,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
  }
  fCompl0 = (uint)(uVar25 >> 0x1d) & 1;
  fCompl1 = (uint)(uVar25 >> 0x3d) & 1;
  uVar25 = 0;
  uVar37 = 0;
  if (0 < (int)nCutNum) {
    uVar37 = (ulong)nCutNum;
  }
  for (; pLVar43 = pCutsR[0], uVar37 != uVar25; uVar25 = uVar25 + 1) {
    pCutsR[uVar25] = pLVar34;
    pLVar34 = (Lf_Cut_t *)(&pLVar34->Sign + lVar24);
  }
  if (p->Iter == 0) {
    nCuts = 0;
  }
  else {
    nCuts = 1;
    Lf_MemLoadCut(&p->vStoreOld,(uint)pLVar23->Cut[0] >> 1,iObj,pCutsR[0],p->pPars->fCutMin,1);
    if (1 < ((uint)pLVar23->Cut[0] ^ (uint)pLVar23->Cut[1])) {
      Lf_MemLoadCut(&p->vStoreOld,(uint)pLVar23->Cut[1] >> 1,iObj,pCutsR[1],p->pPars->fCutMin,1);
    }
    if ((p->fUseEla != 0) && (iVar16 = Lf_ObjMapRefNum(p,iObj), 0 < iVar16)) {
      Lf_CutDeref_rec(p,pCutsR[(uint)pLVar23->Cut[1] & 1]);
    }
    if (local_180c == 1000000000) {
      iVar16 = 0;
      iVar19 = 0;
      for (uVar25 = 0; uVar25 < (byte)pLVar43->field_0x17; uVar25 = uVar25 + 1) {
        iVar17 = Vec_IntEntry(&p->vOffsets,*(int *)((long)&pLVar43[1].Sign + uVar25 * 4));
        if (iVar17 < 0) {
          pGVar27 = Gia_ManObj(p->pGia,*(int *)((long)&pLVar43[1].Sign + uVar25 * 4));
          iVar17 = Lf_ObjArrival_rec(p,pGVar27);
        }
        else {
          pLVar26 = Lf_ObjReadBest(p,*(int *)((long)&pLVar43[1].Sign + uVar25 * 4));
          iVar17 = pLVar26->Delay[0];
        }
        if (iVar16 <= iVar17) {
          iVar16 = iVar17;
        }
        iVar18 = Vec_IntEntry(&p->vRequired,*(int *)((long)&pLVar43[1].Sign + uVar25 * 4));
        iVar17 = iVar18;
        if (iVar18 < iVar19) {
          iVar17 = iVar19;
        }
        if (iVar18 < 1000000000) {
          iVar19 = iVar17;
        }
      }
      local_180c = iVar16 + 1;
      if (iVar16 + 1 < iVar19 + 2) {
        local_180c = iVar19 + 2;
      }
    }
    Lf_CutParams(p,pLVar43,local_180c,FlowRefs,pObj);
    if (1 < ((uint)pLVar23->Cut[1] ^ (uint)pLVar23->Cut[0])) {
      Lf_CutParams(p,pCutsR[1],local_180c,FlowRefs,pObj);
      nCuts = Lf_SetAddCut(pCutsR,1,nCutNum);
      pLVar43 = pCutsR[0];
    }
    if ((pLVar43->field_0x16 & 0x40) != 0) {
      p->nTimeFails = p->nTimeFails + 1;
    }
  }
  p_00 = p->pGia;
  if (local_1828 != 0) {
    pGVar27 = Gia_ObjSiblObj(p_00,iObj);
    uVar7 = *(undefined8 *)pGVar27;
    uVar8 = *(undefined8 *)pObj;
    iVar19 = Lf_ManPrepareSet(p,local_1828,2,&pCutSet2);
    iVar16 = 0;
    if (0 < iVar19) {
      iVar16 = iVar19;
    }
    pLVar34 = pCutSet2;
    while (bVar44 = iVar16 != 0, iVar16 = iVar16 + -1, bVar44) {
      if ((int)pLVar34[1].Sign != local_1828) {
        pLVar43 = pCutsR[(int)nCuts];
        memcpy(pLVar43,pLVar34,lVar24 * 8);
        if (-1 < pLVar43->iFunc) {
          iVar19 = Abc_LitNotCond(pLVar43->iFunc,
                                  ((uint)((ulong)uVar7 >> 0x20) ^ (uint)((ulong)uVar8 >> 0x20)) >>
                                  0x1f);
          pLVar43->iFunc = iVar19;
        }
        Lf_CutParams(p,pLVar43,local_180c,FlowRefs,pObj);
        nCuts = Lf_SetAddCut(pCutsR,nCuts,nCutNum);
      }
      pLVar34 = (Lf_Cut_t *)(&pLVar34->Sign + lVar24);
    }
    p_00 = p->pGia;
  }
  nLutSize = (uint)uVar28;
  if ((p_00->pMuxes == (uint *)0x0) || (p_00->pMuxes[iObj] == 0)) {
    iVar19 = Gia_ObjIsXor(pObj);
    p->CutCount[0] = (double)(iVar15 * iVar14) + p->CutCount[0];
    local_1750 = pCutSet1;
    iVar16 = 1 << ((char)uVar28 - 6U & 0x1f);
    if ((int)nLutSize < 7) {
      iVar16 = 1;
    }
    if (iVar15 < 1) {
      iVar15 = 0;
    }
    if (iVar14 < 1) {
      iVar14 = 0;
    }
    pLVar43 = pCutSet0 + 1;
    pLVar34 = pCutSet0;
    for (iVar17 = 0; iVar17 != iVar14; iVar17 = iVar17 + 1) {
      if ((int)(uint)(byte)pLVar34->field_0x17 <= (int)nLutSize) {
        pLVar40 = local_1750;
        for (iVar18 = 0; iVar18 != iVar15; iVar18 = iVar18 + 1) {
          uVar22 = *(uint *)&pLVar40->field_0x14 >> 0x18;
          if (((int)nLutSize < (int)uVar22) ||
             ((nLutSize < (byte)pLVar34->field_0x17 + uVar22 &&
              (uVar25 = pLVar40->Sign | pLVar34->Sign,
              uVar25 = uVar25 - (uVar25 >> 1 & 0x5555555555555555),
              uVar25 = (uVar25 >> 2 & 0x3333333333333333) + (uVar25 & 0x3333333333333333),
              nLutSize <
              (byte)(((uVar25 >> 4) + uVar25 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)))))
          goto LAB_005c573d;
          p->CutCount[1] = p->CutCount[1] + 1.0;
          pCut = pCutsR[(int)nCuts];
          uVar22 = *(uint *)&pLVar34->field_0x14 >> 0x18;
          uVar36 = *(uint *)&pLVar40->field_0x14 >> 0x18;
          pLVar39 = pLVar40 + 1;
          pLVar9 = pCut + 1;
          if ((uVar22 == nLutSize) && (uVar36 == nLutSize)) {
            for (uVar25 = 0; uVar28 != uVar25; uVar25 = uVar25 + 1) {
              iVar35 = *(int *)((long)&pLVar43->Sign + uVar25 * 4);
              if (iVar35 != *(int *)((long)&pLVar40[1].Sign + uVar25 * 4)) goto LAB_005c573d;
              *(int *)((long)&pLVar9->Sign + uVar25 * 4) = iVar35;
            }
            *(uint *)&pCut->field_0x14 = *(uint *)&pCut->field_0x14 & 0xffffff | nLutSize << 0x18;
            pCut->iFunc = -1;
LAB_005c5298:
            pCut->Sign = pLVar40->Sign | pLVar34->Sign;
            iVar35 = Lf_SetLastCutIsContained(pCutsR,nCuts);
            if (iVar35 == 0) {
              p->CutCount[2] = p->CutCount[2] + 1.0;
              if (p->pPars->fCutMin != 0) {
                iVar35 = p->pPars->nLutSize;
                if (iVar35 < 7) {
                  uVar22 = (uint)(byte)pCut->field_0x17;
                  pwVar30 = Lf_CutTruth(p,pLVar34);
                  uVar25 = *pwVar30;
                  pwVar30 = Lf_CutTruth(p,pLVar40);
                  uVar33 = *pwVar30;
                  uVar36 = Abc_LitIsCompl(pLVar34->iFunc);
                  uVar21 = Abc_LitIsCompl(pLVar40->iFunc);
                  wVar29 = Abc_Tt6Expand(-(ulong)(uVar36 != fCompl0) ^ uVar25,(int *)(pLVar34 + 1),
                                         (uint)(byte)pLVar34->field_0x17,(int *)pLVar9,
                                         (uint)(byte)pCut->field_0x17);
                  wVar32 = Abc_Tt6Expand(-(ulong)(uVar21 != fCompl1) ^ uVar33,(int *)pLVar39,
                                         (uint)(byte)pLVar40->field_0x17,(int *)pLVar9,
                                         (uint)(byte)pCut->field_0x17);
                  uVar25 = wVar32 & wVar29;
                  if (iVar19 != 0) {
                    uVar25 = wVar32 ^ wVar29;
                  }
                  uTruth[0] = -(ulong)((uint)uVar25 & 1) ^ uVar25;
                  iVar35 = Abc_Tt6MinBase(uTruth,(int *)pLVar9,(uint)(byte)pCut->field_0x17);
                  pCut->field_0x17 = (char)iVar35;
                  if ((uTruth[0] & 1) != 0) {
                    __assert_fail("(int)(t & 1) == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                  ,0x3d1,
                                  "int Lf_CutComputeTruth6(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, Lf_Cut_t *, int)"
                                 );
                  }
                  iVar35 = Vec_MemHashInsert(p->vTtMem,uTruth);
                  iVar35 = Abc_Var2Lit(iVar35,(uint)uVar25 & 1);
                  pCut->iFunc = iVar35;
                  uVar36 = *(uint *)&pCut->field_0x14 >> 0x18;
                  if (uVar36 >= uVar22 && uVar36 != uVar22) {
                    __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                  ,0x3d5,
                                  "int Lf_CutComputeTruth6(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, Lf_Cut_t *, int)"
                                 );
                  }
                  if (uVar36 < uVar22) {
LAB_005c56a3:
                    wVar29 = Lf_CutGetSign(pCut);
                    pCut->Sign = wVar29;
                  }
                }
                else {
                  bVar3 = pCut->field_0x17;
                  bVar11 = (char)iVar35 - 6U & 0x1f;
                  uVar22 = 1 << bVar11;
                  local_1748 = Lf_CutTruth(p,pLVar34);
                  pwVar30 = Lf_CutTruth(p,pLVar40);
                  uVar36 = Abc_LitIsCompl(pLVar34->iFunc);
                  Abc_TtCopy(uTruth0,local_1748,uVar22,uVar36 ^ fCompl0);
                  uVar36 = Abc_LitIsCompl(pLVar40->iFunc);
                  Abc_TtCopy(local_1238,pwVar30,uVar22,uVar36 ^ fCompl1);
                  Abc_TtExpand(uTruth0,iVar35,(int *)(pLVar34 + 1),(uint)(byte)pLVar34->field_0x17,
                               (int *)pLVar9,(uint)(byte)pCut->field_0x17);
                  Abc_TtExpand(local_1238,iVar35,(int *)pLVar39,(uint)(byte)pLVar40->field_0x17,
                               (int *)pLVar9,(uint)(byte)pCut->field_0x17);
                  if (1 << bVar11 < 1) {
                    uVar22 = 0;
                  }
                  uVar25 = (ulong)uVar22;
                  if (iVar19 == 0) {
                    uVar22 = (uint)local_1238[0] & (uint)uTruth0[0] & 1;
                    if (uVar22 == 0) {
                      for (uVar33 = 0; uVar25 != uVar33; uVar33 = uVar33 + 1) {
                        uTruth[uVar33] = local_1238[uVar33] & uTruth0[uVar33];
                      }
                      goto LAB_005c562a;
                    }
                    for (uVar33 = 0; uVar25 != uVar33; uVar33 = uVar33 + 1) {
                      uTruth[uVar33] = ~(local_1238[uVar33] & uTruth0[uVar33]);
                    }
                  }
                  else {
                    uVar22 = ((uint)local_1238[0] ^ (uint)uTruth0[0]) & 1;
                    if (uVar22 == 0) {
                      for (uVar33 = 0; uVar25 != uVar33; uVar33 = uVar33 + 1) {
                        uTruth[uVar33] = local_1238[uVar33] ^ uTruth0[uVar33];
                      }
LAB_005c562a:
                      uVar22 = 0;
                    }
                    else {
                      for (uVar33 = 0; uVar25 != uVar33; uVar33 = uVar33 + 1) {
                        uTruth[uVar33] = ~(uTruth0[uVar33] ^ local_1238[uVar33]);
                      }
                    }
                  }
                  iVar35 = Abc_TtMinBase(uTruth,(int *)pLVar9,(uint)(byte)pCut->field_0x17,iVar35);
                  pCut->field_0x17 = (char)iVar35;
                  if ((uTruth[0] & 1) != 0) {
                    __assert_fail("(uTruth[0] & 1) == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                  ,0x3ed,
                                  "int Lf_CutComputeTruth(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, Lf_Cut_t *, int)"
                                 );
                  }
                  iVar35 = Vec_MemHashInsert(p->vTtMem,uTruth);
                  iVar35 = Abc_Var2Lit(iVar35,uVar22);
                  pCut->iFunc = iVar35;
                  uVar22 = *(uint *)&pCut->field_0x14 >> 0x18;
                  if (bVar3 < uVar22) {
                    __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                  ,0x3f1,
                                  "int Lf_CutComputeTruth(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, Lf_Cut_t *, int)"
                                 );
                  }
                  if (uVar22 < bVar3) goto LAB_005c56a3;
                }
              }
              uVar22 = p->pPars->nLutSizeMux;
              if ((uVar22 != 0) && (uVar22 == (byte)pCut->field_0x17)) {
                pwVar30 = Lf_CutTruth(p,pCut);
                iVar35 = Lf_ManFindCofVar(pwVar30,iVar16,(uint)(byte)pCut->field_0x17);
                if (iVar35 == -1) goto LAB_005c573d;
              }
              Lf_CutParams(p,pCut,local_180c,FlowRefs,pObj);
              nCuts = Lf_SetAddCut(pCutsR,nCuts,nCutNum);
            }
          }
          else {
            iVar35 = 0;
            iVar38 = 0;
            if (*(uint *)&pLVar34->field_0x14 < 0x1000000) {
LAB_005c50e5:
              if ((int)(iVar38 + uVar36) <= (int)(iVar35 + nLutSize)) {
                puVar42 = (undefined4 *)((long)&pCut[1].Sign + (long)iVar38 * 4);
                iVar38 = iVar38 << 0x18;
                for (lVar31 = (long)iVar35; lVar31 < (long)(ulong)uVar36; lVar31 = lVar31 + 1) {
                  *puVar42 = *(undefined4 *)((long)&pLVar40[1].Sign + lVar31 * 4);
                  iVar38 = iVar38 + 0x1000000;
                  puVar42 = puVar42 + 1;
                }
LAB_005c5278:
                pCut->iFunc = -1;
                *(uint *)&pCut->field_0x14 = (*(uint *)&pCut->field_0x14 & 0x7fffff) + iVar38;
                goto LAB_005c5298;
              }
            }
            else {
              iVar20 = 0;
              iVar38 = 0;
              if (0xffffff < *(uint *)&pLVar40->field_0x14) {
                iVar35 = 0;
                uVar25 = 0;
                lVar31 = 0;
                do {
                  while( true ) {
                    iVar20 = (int)uVar25;
                    lVar41 = 0;
                    while( true ) {
                      if (uVar28 - lVar31 == lVar41) goto LAB_005c573d;
                      iVar38 = *(int *)((long)&pLVar43->Sign + lVar41 * 4 + (long)iVar20 * 4);
                      iVar4 = *(int *)((long)&pLVar39->Sign + (long)iVar35 * 4);
                      iVar13 = (int)lVar41;
                      iVar12 = (int)lVar31;
                      if (iVar4 <= iVar38) break;
                      *(int *)((long)&pLVar9->Sign + lVar41 * 4 + lVar31 * 4) = iVar38;
                      lVar41 = lVar41 + 1;
                      if ((int)uVar22 <= (int)lVar41 + iVar20) goto LAB_005c547e;
                    }
                    lVar1 = lVar31 + 1 + lVar41;
                    if (iVar38 <= iVar4) break;
                    iVar35 = iVar35 + 1;
                    *(int *)((long)&pLVar9->Sign + lVar41 * 4 + lVar31 * 4) = iVar4;
                    if ((int)uVar36 <= iVar35) {
                      iVar20 = iVar20 + iVar13;
                      goto LAB_005c57c3;
                    }
                    uVar25 = (uVar25 & 0xffffffff) + lVar41 & 0xffffffff;
                    lVar31 = lVar1;
                  }
                  uVar25 = (uVar25 & 0xffffffff) + lVar41 + 1;
                  *(int *)((long)&pLVar9->Sign + lVar41 * 4 + lVar31 * 4) = iVar38;
                  iVar35 = iVar35 + 1;
                  if ((int)uVar22 <= (int)uVar25) {
LAB_005c547e:
                    iVar38 = iVar12 + iVar13 + 1;
                    goto LAB_005c50e5;
                  }
                  lVar31 = lVar1;
                } while (iVar35 < (int)uVar36);
                iVar20 = iVar20 + iVar13 + 1;
LAB_005c57c3:
                iVar38 = iVar12 + iVar13 + 1;
              }
              if ((int)(iVar38 + uVar22) <= (int)(iVar20 + nLutSize)) {
                puVar42 = (undefined4 *)((long)&pCut[1].Sign + (long)iVar38 * 4);
                iVar38 = iVar38 << 0x18;
                for (lVar31 = (long)iVar20; lVar31 < (long)(ulong)uVar22; lVar31 = lVar31 + 1) {
                  *puVar42 = *(undefined4 *)((long)&pLVar43->Sign + lVar31 * 4);
                  iVar38 = iVar38 + 0x1000000;
                  puVar42 = puVar42 + 1;
                }
                goto LAB_005c5278;
              }
            }
          }
LAB_005c573d:
          pLVar40 = (Lf_Cut_t *)(&pLVar40->Sign + lVar24);
        }
      }
      pLVar34 = (Lf_Cut_t *)(&pLVar34->Sign + lVar24);
      pLVar43 = (Lf_Cut_t *)(&pLVar43->Sign + lVar24);
    }
  }
  else {
    iVar19 = Gia_ObjFaninC2(p_00,pObj);
    iVar16 = Gia_ObjFaninId2(p->pGia,iObj);
    iVar17 = Lf_ManPrepareSet(p,iVar16,2,&pCutSet2);
    p->CutCount[0] = (double)(iVar15 * iVar14 * iVar17) + p->CutCount[0];
    iVar16 = 1 << ((char)uVar28 - 6U & 0x1f);
    if (nLutSize < 7) {
      iVar16 = 1;
    }
    if (iVar17 < 1) {
      iVar17 = 0;
    }
    if (iVar15 < 1) {
      iVar15 = 0;
    }
    if (iVar14 < 1) {
      iVar14 = 0;
    }
    pLVar43 = (Lf_Cut_t *)0x0;
    pLVar34 = pCutSet0;
    for (iVar18 = 0; iVar18 != iVar14; iVar18 = iVar18 + 1) {
      if ((int)(uint)(byte)pLVar34->field_0x17 <= (int)nLutSize) {
        pLVar40 = pCutSet1;
        for (iVar35 = 0; iVar35 != iVar15; iVar35 = iVar35 + 1) {
          pLVar39 = pCutSet2;
          iVar38 = iVar17;
          if ((int)(uint)(byte)pLVar40->field_0x17 <= (int)nLutSize) {
            while (iVar38 != 0) {
              if (((int)(uint)(byte)pLVar39->field_0x17 <= (int)nLutSize) &&
                 (uVar28 = pLVar40->Sign | pLVar34->Sign | pLVar39->Sign,
                 uVar28 = uVar28 - (uVar28 >> 1 & 0x5555555555555555),
                 uVar28 = (uVar28 >> 2 & 0x3333333333333333) + (uVar28 & 0x3333333333333333),
                 pLVar43 = pLVar39,
                 (byte)(((uVar28 >> 4) + uVar28 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) <=
                 nLutSize)) {
                p->CutCount[1] = p->CutCount[1] + 1.0;
                pLVar9 = pCutsR[(int)nCuts];
                iVar20 = Lf_CutMergeOrderMux(pLVar34,pLVar40,pLVar39,pLVar9,nLutSize);
                if ((iVar20 != 0) && (iVar20 = Lf_SetLastCutIsContained(pCutsR,nCuts), iVar20 == 0))
                {
                  p->CutCount[2] = p->CutCount[2] + 1.0;
                  if ((p->pPars->fCutMin != 0) &&
                     (iVar20 = Lf_CutComputeTruthMux
                                         (p,pLVar34,pLVar40,pLVar39,fCompl0,fCompl1,iVar19,pLVar9),
                     iVar20 != 0)) {
                    wVar29 = Lf_CutGetSign(pLVar9);
                    pLVar9->Sign = wVar29;
                  }
                  uVar22 = p->pPars->nLutSizeMux;
                  if ((uVar22 != 0) && (uVar22 == (byte)pLVar9->field_0x17)) {
                    pwVar30 = Lf_CutTruth(p,pLVar9);
                    iVar20 = Lf_ManFindCofVar(pwVar30,iVar16,(uint)(byte)pLVar9->field_0x17);
                    if (iVar20 == -1) goto LAB_005c4ea4;
                  }
                  Lf_CutParams(p,pLVar9,local_180c,FlowRefs,pObj);
                  nCuts = Lf_SetAddCut(pCutsR,nCuts,nCutNum);
                }
              }
LAB_005c4ea4:
              pLVar39 = (Lf_Cut_t *)(&pLVar39->Sign + lVar24);
              iVar38 = iVar38 + -1;
            }
          }
          pLVar40 = (Lf_Cut_t *)(&pLVar40->Sign + lVar24);
        }
      }
      pLVar34 = (Lf_Cut_t *)(&pLVar34->Sign + lVar24);
    }
    if (p->pPars->fCutGroup != 0) {
      if (pLVar43->field_0x17 != '\x01') {
        __assert_fail("pCutSave->nLeaves == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                      ,0x4fd,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
      }
      wVar29 = pLVar43[1].Sign;
      iVar16 = Gia_ObjFaninId2(p->pGia,iObj);
      if ((int)wVar29 != iVar16) {
        __assert_fail("pCutSave->pLeaves[0] == Gia_ObjFaninId2(p->pGia, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                      ,0x4fe,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
      }
      pLVar34 = pCutSet0;
      for (iVar16 = 0; iVar16 != iVar14; iVar16 = iVar16 + 1) {
        pLVar40 = pCutSet1;
        iVar17 = iVar15;
        if ((int)(uint)(byte)pLVar34->field_0x17 <= (int)nLutSize) {
          while (iVar17 != 0) {
            uVar22 = *(uint *)&pLVar40->field_0x14 >> 0x18;
            if ((int)uVar22 <= (int)nLutSize) {
              iVar18 = p->pPars->nLutSize;
              if (iVar18 <= (int)((byte)pLVar34->field_0x17 + uVar22)) {
                __assert_fail("(int)pCut0->nLeaves + (int)pCut1->nLeaves + 1 <= p->pPars->nLutSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                              ,0x502,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
              }
              p->CutCount[1] = p->CutCount[1] + 1.0;
              pLVar39 = pCutsR[(int)nCuts];
              iVar18 = Lf_CutMergeOrderMux(pLVar34,pLVar40,pLVar43,pLVar39,iVar18);
              if ((iVar18 != 0) && (iVar18 = Lf_SetLastCutIsContained(pCutsR,nCuts), iVar18 == 0)) {
                p->CutCount[2] = p->CutCount[2] + 1.0;
                if ((p->pPars->fCutMin != 0) &&
                   (iVar18 = Lf_CutComputeTruthMux
                                       (p,pLVar34,pLVar40,pLVar43,fCompl0,fCompl1,iVar19,pLVar39),
                   iVar18 != 0)) {
                  wVar29 = Lf_CutGetSign(pLVar39);
                  pLVar39->Sign = wVar29;
                }
                Lf_CutParams(p,pLVar39,local_180c,FlowRefs,pObj);
                nCuts = Lf_SetAddCut(pCutsR,nCuts,nCutNum);
              }
            }
            pLVar40 = (Lf_Cut_t *)(&pLVar40->Sign + lVar24);
            iVar17 = iVar17 + -1;
          }
        }
        pLVar34 = (Lf_Cut_t *)(&pLVar34->Sign + lVar24);
      }
    }
  }
  if (((int)nCuts < 1) || ((int)nCutNum <= (int)nCuts)) {
    __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                  ,0x536,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
  }
  if ((nCuts != 1) && (pCutsR[1]->Delay < pCutsR[0]->Delay)) {
    __assert_fail("nCutsR == 1 || pCutsR[0]->Delay <= pCutsR[1]->Delay",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                  ,0x539,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
  }
  *(ulong *)pLVar23->Cut = *(ulong *)pLVar23->Cut & 0xfffffffefffffffe;
  iVar14 = Lf_MemSaveCut(&p->vStoreNew,pCutsR[0],iObj);
  pLVar34 = pCutsR[1];
  *(ulong *)pLVar23->Cut = CONCAT44(iVar14 * 2,iVar14 * 2) | *(ulong *)pLVar23->Cut & DAT_0080e350;
  iVar14 = pCutsR[0]->Delay;
  pLVar23->Delay[1] = iVar14;
  pLVar23->Delay[0] = iVar14;
  fVar2 = pCutsR[0]->Flow;
  pLVar23->Flow[1] = fVar2;
  pLVar23->Flow[0] = fVar2;
  p->nCutCounts[(byte)pCutsR[0]->field_0x17] = p->nCutCounts[(byte)pCutsR[0]->field_0x17] + 1;
  p->nCutEqual = p->nCutEqual + 1;
  p->CutCount[3] = (double)(int)nCuts + p->CutCount[3];
  if ((nCuts == 1) || (pCutsR[0]->Flow <= pCutsR[1]->Flow + 0.005)) {
    uVar28 = 0;
  }
  else {
    iVar14 = Lf_MemSaveCut(&p->vStoreNew,pCutsR[1],iObj);
    pLVar23->Cut[1] = (Lf_Plc_t)(((uint)pLVar23->Cut[1] & 1) + iVar14 * 2);
    pLVar23->Delay[1] = pLVar34->Delay;
    pLVar23->Flow[1] = pLVar34->Flow;
    p->nCutCounts[(byte)pLVar34->field_0x17] = p->nCutCounts[(byte)pLVar34->field_0x17] + 1;
    p->nCutEqual = p->nCutEqual + -1;
    uVar28 = (ulong)((pLVar34->field_0x16 & 0x40) == 0);
  }
  if (((p->pPars->fUseMux7 != 0) && (puVar10 = p->pGia->pMuxes, puVar10 != (uint *)0x0)) &&
     (puVar10[iObj] != 0)) {
    Lf_MemLoadMuxCut(p,iObj,(Lf_Cut_t *)Lf_ObjCutMux_CutSet);
    Lf_CutParams(p,(Lf_Cut_t *)Lf_ObjCutMux_CutSet,local_180c,FlowRefs,pObj);
    pLVar23->Delay[2] = Lf_ObjCutMux_CutSet._8_4_;
    pLVar23->Flow[2] = (float)Lf_ObjCutMux_CutSet._12_4_;
  }
  if (p->fUseEla != 0) {
    *(byte *)(pLVar23->Cut + uVar28) = *(byte *)(pLVar23->Cut + uVar28) | 1;
    iVar14 = Lf_ObjMapRefNum(p,iObj);
    if (0 < iVar14) {
      Lf_CutRef_rec(p,pCutsR[uVar28]);
    }
  }
  if (pObj->Value != 0) {
    pLVar34 = Lf_ManFetchSet(p,iObj);
    for (uVar28 = 0; uVar37 != uVar28; uVar28 = uVar28 + 1) {
      if ((*(uint *)&pLVar34->field_0x14 >> 0x17 & 1) != 0) {
        __assert_fail("!pCut0->fMux7",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                      ,0x56a,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
      }
      if (uVar28 < nCuts) {
        memcpy(pLVar34,pCutsR[uVar28],lVar24 * 8);
      }
      else if (((uVar28 == nCuts) && (0x1ffffff < *(uint *)&pCutsR[0]->field_0x14)) &&
              ((nCuts == 1 || (0x1ffffff < *(uint *)&pCutsR[1]->field_0x14)))) {
        Lf_CutCreateUnit(pLVar34,iObj);
      }
      else {
        *(uint *)&pLVar34->field_0x14 = *(uint *)&pLVar34->field_0x14 | 0xff000000;
      }
      pLVar34 = (Lf_Cut_t *)(&pLVar34->Sign + lVar24);
    }
  }
  return;
}

Assistant:

void Lf_ObjMergeOrder( Lf_Man_t * p, int iObj )
{
    word CutSet[LF_CUT_MAX][LF_CUT_WORDS] = {{0}};
    Lf_Cut_t * pCutSet0, * pCutSet1, * pCutSet2, * pCut0, * pCut1, * pCut2;
    Lf_Cut_t * pCutSet = (Lf_Cut_t *)CutSet, * pCutsR[LF_CUT_MAX];
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    Lf_Bst_t * pBest = Lf_ObjReadBest(p, iObj);
    float FlowRefs = Lf_ObjFlowRefs(p, iObj);
    int Required   = Lf_ObjRequired(p, iObj);
    int nLutSize   = p->pPars->fCutGroup ? p->pPars->nLutSize/2 : p->pPars->nLutSize;
    int nCutNum    = p->pPars->nCutNum;
    int nCutWords  = p->nCutWords;
    int fComp0     = Gia_ObjFaninC0(pObj);
    int fComp1     = Gia_ObjFaninC1(pObj);
    int nCuts0     = Lf_ManPrepareSet( p, Gia_ObjFaninId0(pObj, iObj), 0, &pCutSet0 );
    int nCuts1     = Lf_ManPrepareSet( p, Gia_ObjFaninId1(pObj, iObj), 1, &pCutSet1 );
    int iSibl      = Gia_ObjSibl(p->pGia, iObj);
    int i, k, n, iCutUsed, nCutsR = 0;
    float Value1 = -1, Value2 = -1;
    assert( !Gia_ObjIsBuf(pObj) );
    Lf_CutSetForEachCut( nCutWords, pCutSet, pCut0, i, nCutNum )
        pCutsR[i] = pCut0;
    if ( p->Iter )
    {
        assert( nCutsR == 0 );
        // load cuts
        Lf_MemLoadCut( &p->vStoreOld, pBest->Cut[0].Handle, iObj, pCutsR[0], p->pPars->fCutMin, 1 );
        if ( Lf_BestDiffCuts(pBest) )
            Lf_MemLoadCut( &p->vStoreOld, pBest->Cut[1].Handle, iObj, pCutsR[1], p->pPars->fCutMin, 1 );
        // deref the cut
        if ( p->fUseEla && Lf_ObjMapRefNum(p, iObj) > 0 )
            Value1 = Lf_CutDeref_rec( p, pCutsR[Lf_BestIndex(pBest)] );
        // update required times
        if ( Required == ABC_INFINITY )//&& !p->fUseEla )
            Required = Lf_CutRequired( p, pCutsR[0] );
        // compute parameters
        Lf_CutParams( p, pCutsR[nCutsR++], Required, FlowRefs, pObj );
        if ( Lf_BestDiffCuts(pBest) )
        {
            assert( nCutsR == 1 );
            Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
            nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
        if ( pCutsR[0]->fLate )
            p->nTimeFails++;
    }
    if ( iSibl )
    {
        Gia_Obj_t * pObjE = Gia_ObjSiblObj(p->pGia, iObj);
        int fCompE = Gia_ObjPhase(pObj) ^ Gia_ObjPhase(pObjE);
        int nCutsE = Lf_ManPrepareSet( p, iSibl, 2, &pCutSet2 );
        Lf_CutSetForEachCut( nCutWords, pCutSet2, pCut2, n, nCutsE )
        {
            if ( pCut2->pLeaves[0] == iSibl )
                continue;
            Lf_CutCopy( pCutsR[nCutsR], pCut2, nCutWords );
            if ( pCutsR[nCutsR]->iFunc >= 0 )
                pCutsR[nCutsR]->iFunc = Abc_LitNotCond( pCutsR[nCutsR]->iFunc, fCompE );
            Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
            nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    if ( Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        Lf_Cut_t * pCutSave = NULL;
        int fComp2 = Gia_ObjFaninC2(p->pGia, pObj);
        int nCuts2 = Lf_ManPrepareSet( p, Gia_ObjFaninId2(p->pGia, iObj), 2, &pCutSet2 );
        p->CutCount[0] += nCuts0 * nCuts1 * nCuts2;
        Lf_CutSetForEachCut( nCutWords, pCutSet0, pCut0, i, nCuts0 ) if ( (int)pCut0->nLeaves <= nLutSize )
        Lf_CutSetForEachCut( nCutWords, pCutSet1, pCut1, k, nCuts1 ) if ( (int)pCut1->nLeaves <= nLutSize )
        Lf_CutSetForEachCut( nCutWords, pCutSet2, pCut2, n, nCuts2 ) if ( (int)pCut2->nLeaves <= nLutSize )
        {
            pCutSave = pCut2;
            if ( Lf_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Lf_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Lf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Lf_CutComputeTruthMux(p, pCut0, pCut1, pCut2, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                pCutsR[nCutsR]->Sign = Lf_CutGetSign(pCutsR[nCutsR]);
            if ( p->pPars->nLutSizeMux && p->pPars->nLutSizeMux == (int)pCutsR[nCutsR]->nLeaves && 
                Lf_ManFindCofVar(Lf_CutTruth(p,pCutsR[nCutsR]), Abc_Truth6WordNum(nLutSize), pCutsR[nCutsR]->nLeaves) == -1 )
                continue;
            Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
            nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
        if ( p->pPars->fCutGroup )
        {
            assert( pCutSave->nLeaves == 1 );
            assert( pCutSave->pLeaves[0] == Gia_ObjFaninId2(p->pGia, iObj) );
            Lf_CutSetForEachCut( nCutWords, pCutSet0, pCut0, i, nCuts0 ) if ( (int)pCut0->nLeaves <= nLutSize )
            Lf_CutSetForEachCut( nCutWords, pCutSet1, pCut1, k, nCuts1 ) if ( (int)pCut1->nLeaves <= nLutSize )
            {
                assert( (int)pCut0->nLeaves + (int)pCut1->nLeaves + 1 <= p->pPars->nLutSize );
    //            if ( Lf_CutCountBits(pCut0->Sign | pCut1->Sign | pCutSave->Sign) > p->pPars->nLutSize )
    //                continue;
                p->CutCount[1]++; 
                if ( !Lf_CutMergeOrderMux(pCut0, pCut1, pCutSave, pCutsR[nCutsR], p->pPars->nLutSize) )
                    continue;
                if ( Lf_SetLastCutIsContained(pCutsR, nCutsR) )
                    continue;
                p->CutCount[2]++;
                if ( p->pPars->fCutMin && Lf_CutComputeTruthMux(p, pCut0, pCut1, pCutSave, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                    pCutsR[nCutsR]->Sign = Lf_CutGetSign(pCutsR[nCutsR]);
    //            if ( p->pPars->nLutSizeMux && p->pPars->nLutSizeMux == (int)pCutsR[nCutsR]->nLeaves && 
    //                Lf_ManFindCofVar(Lf_CutTruth(p,pCutsR[nCutsR]), Abc_Truth6WordNum(nLutSize), pCutsR[nCutsR]->nLeaves) == -1 )
    //                continue;
                Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
                nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
            }
        }
    }
    else
    {
        int fIsXor = Gia_ObjIsXor(pObj);
        p->CutCount[0] += nCuts0 * nCuts1;
        Lf_CutSetForEachCut( nCutWords, pCutSet0, pCut0, i, nCuts0 ) if ( (int)pCut0->nLeaves <= nLutSize )
        Lf_CutSetForEachCut( nCutWords, pCutSet1, pCut1, k, nCuts1 ) if ( (int)pCut1->nLeaves <= nLutSize )
        {
            if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nLutSize && Lf_CutCountBits(pCut0->Sign | pCut1->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Lf_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Lf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Lf_CutComputeTruth(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
                pCutsR[nCutsR]->Sign = Lf_CutGetSign(pCutsR[nCutsR]);
            if ( p->pPars->nLutSizeMux && p->pPars->nLutSizeMux == (int)pCutsR[nCutsR]->nLeaves && 
                Lf_ManFindCofVar(Lf_CutTruth(p,pCutsR[nCutsR]), Abc_Truth6WordNum(nLutSize), pCutsR[nCutsR]->nLeaves) == -1 )
                continue;
            Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
            nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    // debug printout
    if ( 0 )
    {
        printf( "*** Obj = %d  FlowRefs = %.2f  MapRefs = %2d  Required = %2d\n", iObj, FlowRefs, Lf_ObjMapRefNum(p, iObj), Required );
        for ( i = 0; i < nCutsR; i++ )
            Lf_CutPrint( p, pCutsR[i] );
        printf( "\n" );
    }
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
//    assert( Lf_SetCheckArray(pCutsR, nCutsR) );
    // delay cut
    assert( nCutsR == 1 || pCutsR[0]->Delay <= pCutsR[1]->Delay );
    pBest->Cut[0].fUsed = pBest->Cut[1].fUsed = 0;
    pBest->Cut[0].Handle = pBest->Cut[1].Handle = Lf_MemSaveCut(&p->vStoreNew, pCutsR[0], iObj);
    pBest->Delay[0] = pBest->Delay[1] = pCutsR[0]->Delay;
    pBest->Flow[0] = pBest->Flow[1] = pCutsR[0]->Flow;
    p->nCutCounts[pCutsR[0]->nLeaves]++;
    p->CutCount[3] += nCutsR;
    p->nCutEqual++;
    // area cut
    iCutUsed = 0;
    if ( nCutsR > 1 && pCutsR[0]->Flow > pCutsR[1]->Flow + LF_EPSILON )//&& !pCutsR[1]->fLate ) // can remove !fLate
    {
        pBest->Cut[1].Handle = Lf_MemSaveCut(&p->vStoreNew, pCutsR[1], iObj);
        pBest->Delay[1] = pCutsR[1]->Delay;
        pBest->Flow[1] = pCutsR[1]->Flow;
        p->nCutCounts[pCutsR[1]->nLeaves]++;
        p->nCutEqual--;
        if ( !pCutsR[1]->fLate )
            iCutUsed = 1;
    }
    // mux cut
    if ( p->pPars->fUseMux7 && Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        pCut2 = Lf_ObjCutMux( p, iObj );
        Lf_CutParams( p, pCut2, Required, FlowRefs, pObj );
        pBest->Delay[2] = pCut2->Delay;
        pBest->Flow[2] = pCut2->Flow;
        // update area value of the best area cut
//        if ( !pCut2->fLate )
//            pBest->Flow[1] = Abc_MinFloat( pBest->Flow[1], pBest->Flow[2] );
    }
    // reference resulting cut
    if ( p->fUseEla )
    {
        pBest->Cut[iCutUsed].fUsed = 1;
        if ( Lf_ObjMapRefNum(p, iObj) > 0 )
            Value2 = Lf_CutRef_rec( p, pCutsR[iCutUsed] );
//        if ( Value1 < Value2 )
//            printf( "ELA degradated cost at node %d from %d to %d.\n", iObj, Value1, Value2 ), fflush(stdout);
//        assert( Value1 >= Value2 );
//        if ( Value1 != -1 )
//            printf( "%.2f -> %.2f    ", Value1, Value2 );
    }
    if ( pObj->Value == 0 )
        return;
    // store the cutset
    pCutSet = Lf_ManFetchSet(p, iObj);
    Lf_CutSetForEachCut( nCutWords, pCutSet, pCut0, i, nCutNum )
    {
        assert( !pCut0->fMux7 );
        if ( i < nCutsR )
            Lf_CutCopy( pCut0, pCutsR[i], nCutWords );
        else if ( i == nCutsR && pCutsR[0]->nLeaves > 1 && (nCutsR == 1 || pCutsR[1]->nLeaves > 1) )
            Lf_CutCreateUnit( pCut0, iObj );
        else
            pCut0->nLeaves = LF_NO_LEAF;
    }
}